

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int unixUnfetch(sqlite3_file *fd,i64 iOff,void *p)

{
  int *piVar1;
  
  if (p == (void *)0x0) {
    if (fd[0xd].pMethods != (sqlite3_io_methods *)0x0) {
      (*aSyscall[0x17].pCurrent)(fd[0xd].pMethods,fd[0xb].pMethods);
      fd[0xd].pMethods = (sqlite3_io_methods *)0x0;
      fd[10].pMethods = (sqlite3_io_methods *)0x0;
      fd[0xb].pMethods = (sqlite3_io_methods *)0x0;
    }
  }
  else {
    piVar1 = (int *)((long)&fd[9].pMethods + 4);
    *piVar1 = *piVar1 + -1;
  }
  return 0;
}

Assistant:

static int unixUnfetch(sqlite3_file *fd, i64 iOff, void *p){
#if SQLITE_MAX_MMAP_SIZE>0
  unixFile *pFd = (unixFile *)fd;   /* The underlying database file */
  UNUSED_PARAMETER(iOff);

  /* If p==0 (unmap the entire file) then there must be no outstanding
  ** xFetch references. Or, if p!=0 (meaning it is an xFetch reference),
  ** then there must be at least one outstanding.  */
  assert( (p==0)==(pFd->nFetchOut==0) );

  /* If p!=0, it must match the iOff value. */
  assert( p==0 || p==&((u8 *)pFd->pMapRegion)[iOff] );

  if( p ){
    pFd->nFetchOut--;
  }else{
    unixUnmapfile(pFd);
  }

  assert( pFd->nFetchOut>=0 );
#else
  UNUSED_PARAMETER(fd);
  UNUSED_PARAMETER(p);
  UNUSED_PARAMETER(iOff);
#endif
  return SQLITE_OK;
}